

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStress
          (ChElasticityKirchhoffIsothropic *this,ChVector<double> *n,ChVector<double> *m,
          ChVector<double> *eps,ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  Scalar *pSVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  ChMatrix33<double> Q;
  
  auVar15._8_56_ = in_register_00001248;
  auVar15._0_8_ = z_sup;
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar15._0_16_,auVar7);
  if ((auVar7._0_8_ != z_inf) || (NAN(auVar7._0_8_) || NAN(z_inf))) {
    dVar10 = this->m_E;
    dVar5 = this->m_nu + 1.0;
    dVar20 = (z_sup * z_sup - z_inf * z_inf) * 0.5;
    dVar8 = pow(z_sup,3.0);
    dVar9 = pow(z_inf,3.0);
    dVar8 = (dVar8 - dVar9) * 0.3333333333333333;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = this->m_nu;
    auVar7 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar14,auVar14);
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         this->m_E / auVar7._0_8_;
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         this->m_nu *
         Q.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         Q.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         Q.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)&Q,1,3);
    *pSVar6 = 0.0;
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    Q.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         dVar10 / (dVar5 + dVar5);
    ChMatrix33<double>::operator*(&Q,eps);
    dVar10 = z_sup - z_inf;
    ChMatrix33<double>::operator*(&Q,kur);
    n->m_data[0] = dVar20 * local_b8 + dVar10 * local_98;
    n->m_data[1] = dVar20 * dStack_b0 + dVar10 * dStack_90;
    n->m_data[2] = dVar20 * local_a8 + dVar10 * local_88;
    ChMatrix33<double>::operator*(&Q,eps);
    ChMatrix33<double>::operator*(&Q,kur);
    dVar10 = dVar8 * local_a8 + dVar20 * local_88;
    m->m_data[0] = dVar8 * local_b8 + dVar20 * local_98;
    m->m_data[1] = dVar8 * dStack_b0 + dVar20 * dStack_90;
  }
  else {
    dVar5 = z_sup - z_inf;
    dVar10 = this->m_nu;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar10;
    auVar7 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar16,auVar16);
    dVar20 = this->m_E / (dVar10 + 1.0 + dVar10 + 1.0);
    auVar13._0_8_ = (dVar5 * this->m_E) / auVar7._0_8_;
    auVar13._8_8_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = eps->m_data[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = auVar13._0_8_ * dVar10 * eps->m_data[1];
    auVar7 = vfmadd231sd_fma(auVar17,auVar13,auVar1);
    auVar19._0_8_ = (dVar5 * dVar5 * auVar13._0_8_) / 12.0;
    auVar19._8_8_ = 0;
    n->m_data[0] = auVar7._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = eps->m_data[1];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar13._0_8_ * eps->m_data[0] * this->m_nu;
    auVar7 = vfmadd231sd_fma(auVar18,auVar13,auVar2);
    n->m_data[1] = auVar7._0_8_;
    n->m_data[2] = dVar5 * dVar20 * eps->m_data[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = kur->m_data[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar19._0_8_ * this->m_nu * kur->m_data[1];
    auVar7 = vfmadd231sd_fma(auVar11,auVar19,auVar3);
    m->m_data[0] = auVar7._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = kur->m_data[1];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar19._0_8_ * this->m_nu * kur->m_data[0];
    auVar7 = vfmadd231sd_fma(auVar12,auVar19,auVar4);
    m->m_data[1] = auVar7._0_8_;
    dVar10 = ((dVar5 * dVar5 * dVar5 * dVar20) / 12.0) * kur->m_data[2];
  }
  m->m_data[2] = dVar10;
  return;
}

Assistant:

void ChElasticityKirchhoffIsothropic::ComputeStress(  ChVector<>& n,
                                                      ChVector<>& m,
                                                      const ChVector<>& eps,
                                                      const ChVector<>& kur,
                                                      const double z_inf,
                                                      const double z_sup,
                                                      const double angle) {
    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;

        n.x() = eps.x() * C + eps.y() * m_nu * C;
		n.y() = eps.y() * C + eps.x() * m_nu * C;
        n.z() = eps.z() * G * h;

		m.x() = kur.x() * D + kur.y() * (m_nu * D);
		m.y() = kur.y() * D + kur.x() * (m_nu * D);
        m.z() = kur.z() * F;
    } else {
        double G = m_E / (2. * (1. + m_nu));
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));
		ChMatrix33<> Q;
		Q(0, 0) = m_E / (1. - m_nu * m_nu);
		Q(0, 1) = m_nu * Q(0, 0);
		Q(0, 2) = 0;
		Q(1, 0) = Q(0, 1);
		Q(1, 1) = Q(0, 0);
		Q(1, 3) = 0;
		Q(2, 0) = 0;
		Q(2, 1) = 0;
		Q(2, 2) = G;
        n   = h1 * (Q * eps) + h2 * (Q * kur);
		m   = h2 * (Q * eps) + h3 * (Q * kur);
    }
}